

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O2

int VP8EncLoop(VP8Encoder *enc)

{
  VP8EncProba *proba;
  uint64_t *puVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  VP8RDLevel rd_opt;
  float q;
  score_t sVar5;
  VP8Encoder *pVVar6;
  VP8BitWriter *bw;
  int iVar7;
  int delta;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  long lVar16;
  int16_t (*paiVar17) [16];
  int16_t (*paiVar18) [16];
  long lVar19;
  int *piVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  bool bVar28;
  bool bVar29;
  float fVar30;
  double dVar31;
  int16_t (*local_13a0) [16];
  long local_1390;
  int16_t (*local_1368) [16];
  PassStats local_1328;
  int *local_12f0;
  uint64_t local_12e8;
  double local_12e0;
  VP8Residual local_12d8;
  VP8ModeScore info;
  VP8EncIterator it;
  
  iVar7 = PreLoopInitialize(enc);
  if (iVar7 == 0) {
    iVar7 = 0;
  }
  else {
    iVar7 = enc->method;
    iVar11 = enc->do_search;
    iVar24 = enc->config->pass;
    delta = (iVar24 / 2 + 0x14) / iVar24;
    iVar3 = enc->percent;
    iVar22 = enc->mb_h * enc->mb_w;
    InitPassStats(enc,&local_1328);
    memset((enc->proba).stats,0,0x1080);
    iVar23 = iVar22;
    if ((iVar7 == 3 || iVar7 == 0) && iVar11 == 0) {
      if (iVar7 == 3) {
        iVar8 = iVar22 >> 1;
        iVar23 = 100;
      }
      else {
        iVar8 = iVar22 >> 2;
        iVar23 = 0x32;
      }
      if (200 < iVar22) {
        iVar23 = iVar8;
      }
    }
    local_12f0 = &enc->percent;
    local_12e8 = (long)iVar23 * 0x180;
    proba = &enc->proba;
    do {
      iVar22 = local_1328.do_size_search;
      q = local_1328.q;
      fVar30 = ABS(local_1328.dq);
      iVar8 = iVar24 + -1;
      dVar31 = local_1328.value;
      while( true ) {
        if (iVar24 < 1) goto LAB_0012a951;
        bVar28 = true;
        if (iVar8 != 0 && 0.4 < fVar30) {
          bVar28 = enc->max_i4_header_bits == 0;
        }
        local_12e0 = dVar31;
        VP8IteratorInit(enc,&it);
        SetLoopParams(enc,q);
        local_1390 = 0;
        lVar21 = 0;
        local_13a0 = (int16_t (*) [16])0x0;
        iVar10 = iVar23;
        do {
          VP8IteratorImport(&it,(uint8_t *)0x0);
          iVar9 = VP8Decimate(&it,&info,(uint)(2 < iVar7 || iVar11 != 0));
          pVVar6 = it.enc;
          if (iVar9 != 0) {
            piVar20 = &(enc->proba).nb_skip;
            *piVar20 = *piVar20 + 1;
          }
          VP8IteratorNzToBytes(&it);
          bVar29 = ((uint)*it.mb & 3) != 1;
          if (bVar29) {
            iVar9 = 3;
          }
          else {
            VP8InitResidual(0,1,pVVar6,&local_12d8);
            (*VP8SetResidualCoeffs)(info.y_dc_levels,&local_12d8);
            it.top_nz[8] = VP8RecordCoeffs(it.left_nz[8] + it.top_nz[8],&local_12d8);
            iVar9 = 0;
            it.left_nz[8] = it.top_nz[8];
          }
          VP8InitResidual((uint)!bVar29,iVar9,pVVar6,&local_12d8);
          paiVar17 = info.y_ac_levels;
          for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
            paiVar18 = paiVar17;
            for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
              iVar9 = it.left_nz[lVar19];
              iVar4 = it.top_nz[lVar16];
              (*VP8SetResidualCoeffs)(*paiVar18,&local_12d8);
              iVar9 = VP8RecordCoeffs(iVar9 + iVar4,&local_12d8);
              it.left_nz[lVar19] = iVar9;
              it.top_nz[lVar16] = iVar9;
              paiVar18 = paiVar18 + 1;
            }
            paiVar17 = paiVar17 + 4;
          }
          VP8InitResidual(0,2,pVVar6,&local_12d8);
          piVar20 = it.top_nz + 4;
          local_1368 = info.uv_levels;
          for (uVar12 = 0; uVar12 < 3; uVar12 = uVar12 + 2) {
            paiVar17 = local_1368;
            for (uVar26 = 0; uVar26 != 2; uVar26 = uVar26 + 1) {
              uVar25 = uVar26 | uVar12 | 4;
              paiVar18 = paiVar17;
              for (lVar19 = 0; lVar19 != 2; lVar19 = lVar19 + 1) {
                iVar9 = it.left_nz[uVar25];
                iVar4 = piVar20[lVar19];
                (*VP8SetResidualCoeffs)(*paiVar18,&local_12d8);
                iVar9 = VP8RecordCoeffs(iVar9 + iVar4,&local_12d8);
                it.left_nz[uVar25] = iVar9;
                piVar20[lVar19] = iVar9;
                paiVar18 = paiVar18 + 1;
              }
              paiVar17 = paiVar17 + 2;
            }
            local_1368 = local_1368 + 4;
            piVar20 = piVar20 + 2;
          }
          VP8IteratorBytesToNz(&it);
          sVar5 = info.H;
          local_1390 = local_1390 + info.R;
          local_13a0 = (int16_t (*) [16])((long)local_13a0 + info.D);
          if ((delta != 0) &&
             (iVar9 = VP8IteratorProgress(&it,delta), dVar31 = local_12e0, iVar9 == 0))
          goto LAB_0012a5af;
          local_1390 = local_1390 + sVar5;
          lVar21 = lVar21 + sVar5;
          VP8IteratorSaveBoundary(&it);
          iVar9 = VP8IteratorNext(&it);
        } while ((iVar9 != 0) && (bVar29 = 1 < iVar10, iVar10 = iVar10 + -1, bVar29));
        uVar12 = lVar21 + (enc->segment_hdr).size;
        if (iVar22 == 0) {
          dVar31 = GetPSNR((uint64_t)local_13a0,local_12e8);
        }
        else {
          iVar10 = FinalizeSkipProba(enc);
          iVar9 = FinalizeTokenProbas(proba);
          dVar31 = (double)(((long)iVar9 + local_1390 + uVar12 + (long)iVar10 + 0x400 >> 0xb) + 0x1e
                           );
        }
        if (uVar12 == 0) goto LAB_0012a5af;
        if ((uVar12 < 0x3fc00001) || (enc->max_i4_header_bits < 1)) break;
        enc->max_i4_header_bits = (uint)enc->max_i4_header_bits >> 1;
      }
    } while ((!bVar28) &&
            ((local_1328.value = dVar31, iVar24 = iVar8, iVar11 == 0 ||
             (ComputeNextQ(&local_1328), dVar31 = local_1328.value, 0.4 < ABS(local_1328.dq)))));
LAB_0012a951:
    local_1328.value = dVar31;
    if ((iVar11 == 0) || (local_1328.do_size_search == 0)) {
      FinalizeSkipProba(enc);
      FinalizeTokenProbas(proba);
    }
    VP8CalculateLevelCosts(proba);
    WebPReportProgress(enc->pic,iVar3 + 0x14,local_12f0);
    dVar31 = local_1328.value;
LAB_0012a5af:
    local_1328.value = dVar31;
    VP8IteratorInit(enc,&it);
    VP8InitFilter(&it);
    do {
      iVar7 = (enc->proba).use_skip_proba;
      rd_opt = enc->rd_opt_level;
      VP8IteratorImport(&it,(uint8_t *)0x0);
      iVar11 = VP8Decimate(&it,&info,rd_opt);
      bw = it.bw;
      pVVar6 = it.enc;
      if ((iVar11 == 0) || (iVar7 == 0)) {
        bVar2 = *(byte *)it.mb;
        VP8IteratorNzToBytes(&it);
        uVar13 = VP8BitWriterPos(bw);
        bVar28 = (bVar2 & 3) != 1;
        if (bVar28) {
          iVar7 = 3;
        }
        else {
          VP8InitResidual(0,1,pVVar6,(VP8Residual *)&local_1328);
          (*VP8SetResidualCoeffs)(info.y_dc_levels,(VP8Residual *)&local_1328);
          it.top_nz[8] = PutCoeffs(bw,it.left_nz[8] + it.top_nz[8],(VP8Residual *)&local_1328);
          iVar7 = 0;
          it.left_nz[8] = it.top_nz[8];
        }
        VP8InitResidual((uint)!bVar28,iVar7,pVVar6,(VP8Residual *)&local_1328);
        paiVar17 = info.y_ac_levels;
        for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
          paiVar18 = paiVar17;
          for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
            iVar7 = it.left_nz[lVar21];
            iVar11 = it.top_nz[lVar19];
            (*VP8SetResidualCoeffs)(*paiVar18,(VP8Residual *)&local_1328);
            iVar7 = PutCoeffs(bw,iVar7 + iVar11,(VP8Residual *)&local_1328);
            it.left_nz[lVar21] = iVar7;
            it.top_nz[lVar19] = iVar7;
            paiVar18 = paiVar18 + 1;
          }
          paiVar17 = paiVar17 + 4;
        }
        uVar14 = VP8BitWriterPos(bw);
        VP8InitResidual(0,2,pVVar6,(VP8Residual *)&local_1328);
        piVar20 = it.top_nz + 4;
        local_13a0 = info.uv_levels;
        for (uVar12 = 0; uVar12 < 3; uVar12 = uVar12 + 2) {
          paiVar17 = local_13a0;
          for (uVar26 = 0; uVar26 != 2; uVar26 = uVar26 + 1) {
            uVar25 = uVar26 | uVar12 | 4;
            paiVar18 = paiVar17;
            for (lVar21 = 0; lVar21 != 2; lVar21 = lVar21 + 1) {
              iVar7 = it.left_nz[uVar25];
              iVar11 = piVar20[lVar21];
              (*VP8SetResidualCoeffs)(*paiVar18,(VP8Residual *)&local_1328);
              iVar7 = PutCoeffs(bw,iVar7 + iVar11,(VP8Residual *)&local_1328);
              it.left_nz[uVar25] = iVar7;
              piVar20[lVar21] = iVar7;
              paiVar18 = paiVar18 + 1;
            }
            paiVar17 = paiVar17 + 2;
          }
          local_13a0 = local_13a0 + 4;
          piVar20 = piVar20 + 2;
        }
        uVar27 = bVar2 >> 5 & 3;
        uVar15 = VP8BitWriterPos(bw);
        it.luma_bits = uVar14 - uVar13;
        it.uv_bits = uVar15 - uVar14;
        puVar1 = it.bit_count[uVar27] + ((bVar2 & 3) == 1);
        *puVar1 = *puVar1 + (uVar14 - uVar13);
        puVar1 = it.bit_count[uVar27] + 2;
        *puVar1 = *puVar1 + (uVar15 - uVar14);
        VP8IteratorBytesToNz(&it);
        if ((it.bw)->error == 0) goto LAB_0012a8e2;
LAB_0012a925:
        iVar7 = 0;
        break;
      }
      if (((uint)*it.mb & 3) == 1) {
        *it.nz = 0;
        it.left_nz[8] = 0;
      }
      else {
        *it.nz = *it.nz & 0x1000000;
      }
LAB_0012a8e2:
      StoreSideInfo(&it);
      VP8StoreFilterStats(&it);
      VP8IteratorExport(&it);
      iVar7 = VP8IteratorProgress(&it,0x14);
      VP8IteratorSaveBoundary(&it);
      if (iVar7 == 0) goto LAB_0012a925;
      iVar11 = VP8IteratorNext(&it);
    } while (iVar11 != 0);
    iVar7 = PostLoopFinalize(&it,iVar7);
  }
  return iVar7;
}

Assistant:

int VP8EncLoop(VP8Encoder* const enc) {
  VP8EncIterator it;
  int ok = PreLoopInitialize(enc);
  if (!ok) return 0;

  StatLoop(enc);  // stats-collection loop

  VP8IteratorInit(enc, &it);
  VP8InitFilter(&it);
  do {
    VP8ModeScore info;
    const int dont_use_skip = !enc->proba.use_skip_proba;
    const VP8RDLevel rd_opt = enc->rd_opt_level;

    VP8IteratorImport(&it, NULL);
    // Warning! order is important: first call VP8Decimate() and
    // *then* decide how to code the skip decision if there's one.
    if (!VP8Decimate(&it, &info, rd_opt) || dont_use_skip) {
      CodeResiduals(it.bw, &it, &info);
      if (it.bw->error) {
        // enc->pic->error_code is set in PostLoopFinalize().
        ok = 0;
        break;
      }
    } else {   // reset predictors after a skip
      ResetAfterSkip(&it);
    }
    StoreSideInfo(&it);
    VP8StoreFilterStats(&it);
    VP8IteratorExport(&it);
    ok = VP8IteratorProgress(&it, 20);
    VP8IteratorSaveBoundary(&it);
  } while (ok && VP8IteratorNext(&it));

  return PostLoopFinalize(&it, ok);
}